

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiline_string.cpp
# Opt level: O0

void __thiscall
MultilineString_Simple_Test::~MultilineString_Simple_Test(MultilineString_Simple_Test *this)

{
  MultilineString_Simple_Test *this_local;
  
  ~MultilineString_Simple_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(MultilineString, Simple) {
    test_parsing("\"\"\"\"\"\"", "");
    test_parsing("\"\"\" \" \"\"\"", " \" ");
    test_parsing("\"\"\" \"\" \"\"\"", " \"\" ");
    test_parsing("\"\"\"\" \"\"\"", "\" ");
    test_parsing("\"\"\"\"\" \"\"\"", "\"\" ");
    test_parsing("\"\"\"test\"\"\"", "test");
    test_parsing("\"\"\"test\ntest\"\"\"", "test\ntest");
}